

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptString::GetDiagValueString
          (JavascriptString *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  charcount_t countNeeded;
  char16 *str;
  ScriptContext *requestContext_local;
  StringBuilder<Memory::ArenaAllocator> *stringBuilder_local;
  JavascriptString *this_local;
  
  StringBuilder<Memory::ArenaAllocator>::Append(stringBuilder,L'\"');
  str = GetString(this);
  countNeeded = GetLength(this);
  StringBuilder<Memory::ArenaAllocator>::Append(stringBuilder,str,countNeeded);
  StringBuilder<Memory::ArenaAllocator>::Append(stringBuilder,L'\"');
  return 1;
}

Assistant:

BOOL JavascriptString::GetDiagValueString(StringBuilder<ArenaAllocator>* stringBuilder, ScriptContext* requestContext)
    {
        stringBuilder->Append(_u('"'));
        stringBuilder->Append(this->GetString(), this->GetLength());
        stringBuilder->Append(_u('"'));
        return TRUE;
    }